

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haptic.c
# Opt level: O2

_Bool al_rumble_haptic(ALLEGRO_HAPTIC *hap,double intensity,double duration,
                      ALLEGRO_HAPTIC_EFFECT_ID *id)

{
  _Bool _Var1;
  ALLEGRO_HAPTIC_EFFECT effect;
  
  effect.type = 1;
  effect.replay.delay = 0.0;
  effect.replay.length = duration;
  effect.data.constant.level = intensity;
  effect.data.constant.envelope.attack_length = intensity;
  _Var1 = al_upload_and_play_haptic_effect(hap,&effect,id,1);
  return _Var1;
}

Assistant:

bool al_rumble_haptic(ALLEGRO_HAPTIC *hap,
   double intensity, double duration, ALLEGRO_HAPTIC_EFFECT_ID *id)
{
   ALLEGRO_HAPTIC_EFFECT effect;
   ASSERT(hap);
   ASSERT(id);

   effect.type = ALLEGRO_HAPTIC_RUMBLE;
   effect.data.rumble.strong_magnitude = intensity;
   effect.data.rumble.weak_magnitude = intensity;
   effect.replay.delay = 0.0;
   effect.replay.length = duration;
   return al_upload_and_play_haptic_effect(hap, &effect, id, 1);
}